

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void * ps_timer_create_(char *timer_name)

{
  char *in_RDI;
  void **objects;
  void *local_10;
  
  ps_register_thread_internal();
  local_10 = calloc((long)num_tools_registered,8);
  if (timer_create_function != (ps_timer_create_t)0x0) {
    local_10 = (*timer_create_function)(in_RDI);
  }
  return local_10;
}

Assistant:

void* ps_timer_create_(const char *timer_name) {
    ps_register_thread_internal();
    void ** objects = (void **)calloc(num_tools_registered, sizeof(void*));
    if (timer_create_function != NULL)
        objects = (void *)timer_create_function(timer_name);
    return (void*)(objects);
}